

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O1

exr_result_t
hufBuildDecTable(exr_const_context_t pctxt,uint64_t *hcode,uint32_t im,uint32_t iM,HufDec *hdecod)

{
  bool bVar1;
  int32_t *piVar2;
  uint uVar3;
  uint32_t *puVar4;
  uint32_t *puVar5;
  byte bVar6;
  ulong uVar7;
  exr_result_t eVar8;
  long lVar9;
  code *pcVar10;
  code *pcVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  HufDec *pHVar15;
  exr_result_t unaff_R15D;
  bool bVar16;
  
  if (pctxt == (exr_const_context_t)0x0) {
    pcVar10 = internal_exr_alloc;
    pcVar11 = internal_exr_free;
  }
  else {
    pcVar10 = pctxt->alloc_fn;
    pcVar11 = pctxt->free_fn;
  }
  if (im <= iM) {
    uVar12 = (ulong)im;
    do {
      uVar7 = hcode[uVar12];
      uVar13 = uVar7 >> 6;
      bVar1 = true;
      if (uVar13 >> ((byte)uVar7 & 0x3f) == 0) {
        uVar3 = (uint)uVar7 & 0x3f;
        if (uVar3 < 0xf) {
          if ((uVar7 & 0x3f) != 0) {
            bVar6 = 0xe - (char)uVar3;
            lVar14 = uVar13 << (bVar6 & 0x3f);
            eVar8 = 0x17;
            if (hdecod[lVar14].len == 0) {
              lVar9 = 1L << (bVar6 & 0x3f);
              pHVar15 = hdecod + lVar14 + 1;
              bVar16 = false;
              do {
                if (pHVar15[-1].p != (uint32_t *)0x0) break;
                pHVar15[-1].len = uVar3;
                pHVar15[-1].lit = (uint32_t)uVar12;
                lVar9 = lVar9 + -1;
                bVar16 = lVar9 == 0;
                if (bVar16) {
                  bVar1 = false;
                  eVar8 = unaff_R15D;
                  break;
                }
                piVar2 = &pHVar15->len;
                pHVar15 = pHVar15 + 1;
              } while (*piVar2 == 0);
            }
            else {
              bVar16 = false;
            }
            goto joined_r0x0011596d;
          }
        }
        else {
          uVar13 = uVar13 >> ((char)uVar3 - 0xeU & 0x3f);
          if (hdecod[uVar13].len == 0) {
            uVar3 = hdecod[uVar13].lit + 1;
            hdecod[uVar13].lit = uVar3;
            puVar5 = hdecod[uVar13].p;
            if (puVar5 == (uint32_t *)0x0) {
              puVar5 = (uint32_t *)(*pcVar10)(4);
              hdecod[uVar13].p = puVar5;
            }
            else {
              puVar4 = (uint32_t *)(*pcVar10)((ulong)uVar3 << 2);
              hdecod[uVar13].p = puVar4;
              if ((puVar4 != (uint32_t *)0x0) && (hdecod[uVar13].lit != 1)) {
                uVar7 = 0;
                do {
                  puVar4[uVar7] = puVar5[uVar7];
                  uVar7 = uVar7 + 1;
                } while (uVar7 < hdecod[uVar13].lit - 1);
              }
              (*pcVar11)(puVar5);
            }
            puVar5 = hdecod[uVar13].p;
            if (puVar5 == (uint32_t *)0x0) {
              unaff_R15D = 1;
            }
            else {
              puVar5[hdecod[uVar13].lit - 1] = (uint32_t)uVar12;
            }
            bVar16 = puVar5 != (uint32_t *)0x0;
            eVar8 = unaff_R15D;
          }
          else {
            bVar16 = false;
            eVar8 = 0x17;
          }
joined_r0x0011596d:
          unaff_R15D = eVar8;
          if (!bVar16) goto LAB_00115a3f;
        }
        bVar1 = false;
      }
      else {
        unaff_R15D = 0x17;
      }
LAB_00115a3f:
      if (bVar1) {
        return unaff_R15D;
      }
      uVar12 = uVar12 + 1;
    } while (iM + 1 != (int)uVar12);
  }
  return 0;
}

Assistant:

static exr_result_t
hufBuildDecTable (
    exr_const_context_t pctxt,
    const uint64_t*     hcode,
    uint32_t            im,
    uint32_t            iM,
    HufDec*             hdecod)
{
    void* (*alloc_fn) (size_t) = pctxt ? pctxt->alloc_fn : internal_exr_alloc;
    void (*free_fn) (void*)    = pctxt ? pctxt->free_fn : internal_exr_free;

    //
    // Init hashtable & loop on all codes.
    // Assumes that hufClearDecTable(hdecod) has already been called.
    //

    for (; im <= iM; im++)
    {
        uint64_t c = hufCode (hcode[im]);
        int      l = hufLength (hcode[im]);

        if (c >> l)
        {
            //
            // Error: c is supposed to be an l-bit code,
            // but c contains a value that is greater
            // than the largest l-bit number.
            //

            return EXR_ERR_CORRUPT_CHUNK;
        }

        if (l > HUF_DECBITS)
        {
            //
            // Long code: add a secondary entry
            //

            HufDec* pl = hdecod + (c >> (l - HUF_DECBITS));

            if (pl->len)
            {
                //
                // Error: a short code has already
                // been stored in table entry *pl.
                //

                return EXR_ERR_CORRUPT_CHUNK;
            }

            pl->lit++;

            if (pl->p)
            {
                uint32_t* p = pl->p;
                pl->p = (uint32_t*) alloc_fn (sizeof (uint32_t) * pl->lit);

                if (pl->p)
                {
                    for (uint32_t i = 0; i < pl->lit - 1; ++i)
                        pl->p[i] = p[i];
                }

                free_fn (p);
            }
            else { pl->p = (uint32_t*) alloc_fn (sizeof (uint32_t)); }

            if (!pl->p) return EXR_ERR_OUT_OF_MEMORY;

            pl->p[pl->lit - 1] = im;
        }
        else if (l)
        {
            //
            // Short code: init all primary entries
            //

            HufDec* pl = hdecod + (c << (HUF_DECBITS - l));

            for (uint64_t i = ((uint64_t) 1) << (HUF_DECBITS - l); i > 0;
                 i--, pl++)
            {
                if (pl->len || pl->p)
                {
                    //
                    // Error: a short code or a long code has
                    // already been stored in table entry *pl.
                    //

                    return EXR_ERR_CORRUPT_CHUNK;
                }

                pl->len = (int32_t) l;
                pl->lit = im;
            }
        }
    }
    return EXR_ERR_SUCCESS;
}